

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O0

void highbd_calc8x8var_avx2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,uint32_t *sse,int *sum)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  int in_ECX;
  undefined1 (*in_RDX) [16];
  int in_ESI;
  undefined1 (*in_RDI) [16];
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i v_d;
  __m128i v_d1_d;
  __m128i v_d0_d;
  __m256i v_d_lh;
  __m256i v_d_h;
  __m256i v_d_l;
  __m256i v_sum0;
  __m256i v_sum01;
  __m256i v_sum00;
  __m256i v_sqrdiff;
  __m256i v_diff;
  __m256i v_p_b;
  __m256i v_p_a;
  __m128i v_p_b1;
  __m128i v_p_b0;
  __m128i v_p_a1;
  __m128i v_p_a0;
  int i;
  __m256i v_sse_d;
  __m256i v_sum_d;
  undefined4 local_5b0;
  undefined4 uStack_5ac;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined1 auStack_570 [16];
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_450;
  undefined8 uStack_448;
  int local_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 (*local_378) [16];
  undefined1 (*local_368) [16];
  undefined1 local_50 [16];
  
  auVar1 = ZEXT1632(ZEXT816(0));
  local_3e0 = ZEXT1632(ZEXT816(0));
  local_3e4 = 0;
  local_3c0 = auVar1;
  local_378 = in_RDX;
  local_368 = in_RDI;
  while( true ) {
    if (7 < local_3e4) break;
    auVar3 = ZEXT116(0) * auVar1._0_16_ +
             ZEXT116(1) * *(undefined1 (*) [16])(*local_368 + (long)in_ESI * 2);
    auVar4 = ZEXT116(0) * auVar1._0_16_ +
             ZEXT116(1) * *(undefined1 (*) [16])(*local_378 + (long)in_ECX * 2);
    uStack_450 = auVar3._0_8_;
    uStack_448 = auVar3._8_8_;
    uStack_470 = auVar4._0_8_;
    uStack_468 = auVar4._8_8_;
    auVar2._16_8_ = uStack_450;
    auVar2._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*local_368 + (long)in_ESI * 2) +
         ZEXT116(1) * *local_368;
    auVar2._24_8_ = uStack_448;
    auVar1._16_8_ = uStack_470;
    auVar1._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*local_378 + (long)in_ECX * 2) +
         ZEXT116(1) * *local_378;
    auVar1._24_8_ = uStack_468;
    auVar2 = vpsubw_avx2(auVar2,auVar1);
    auVar1 = vpmaddwd_avx2(auVar2,auVar2);
    local_3c0 = vpaddw_avx2(local_3c0,auVar2);
    local_3e0 = vpaddd_avx2(local_3e0,auVar1);
    local_368 = (undefined1 (*) [16])(*local_368 + (long)(in_ESI << 1) * 2);
    local_378 = (undefined1 (*) [16])(*local_378 + (long)(in_ECX << 1) * 2);
    local_3e4 = local_3e4 + 2;
  }
  auVar1 = vpmovsxwd_avx2(local_3c0._0_16_);
  auVar2 = vpmovsxwd_avx2(local_50);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpunpckldq_avx2(auVar1,local_3e0);
  auVar1 = vpunpckhdq_avx2(auVar1,local_3e0);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auStack_570 = auVar1._16_16_;
  auVar3._8_8_ = uStack_598;
  auVar3._0_8_ = local_5a0;
  auVar3 = vpaddd_avx(auStack_570,auVar3);
  auVar4 = vpsrldq_avx(auVar3,8);
  auVar3 = vpaddd_avx(auVar3,auVar4);
  local_5b0 = auVar3._0_4_;
  *in_R9 = local_5b0;
  uStack_5ac = auVar3._4_4_;
  *in_R8 = uStack_5ac;
  return;
}

Assistant:

static void highbd_calc8x8var_avx2(const uint16_t *src, int src_stride,
                                   const uint16_t *ref, int ref_stride,
                                   uint32_t *sse, int *sum) {
  __m256i v_sum_d = _mm256_setzero_si256();
  __m256i v_sse_d = _mm256_setzero_si256();
  for (int i = 0; i < 8; i += 2) {
    const __m128i v_p_a0 = _mm_loadu_si128((const __m128i *)src);
    const __m128i v_p_a1 = _mm_loadu_si128((const __m128i *)(src + src_stride));
    const __m128i v_p_b0 = _mm_loadu_si128((const __m128i *)ref);
    const __m128i v_p_b1 = _mm_loadu_si128((const __m128i *)(ref + ref_stride));
    __m256i v_p_a = _mm256_castsi128_si256(v_p_a0);
    __m256i v_p_b = _mm256_castsi128_si256(v_p_b0);
    v_p_a = _mm256_inserti128_si256(v_p_a, v_p_a1, 1);
    v_p_b = _mm256_inserti128_si256(v_p_b, v_p_b1, 1);
    const __m256i v_diff = _mm256_sub_epi16(v_p_a, v_p_b);
    const __m256i v_sqrdiff = _mm256_madd_epi16(v_diff, v_diff);
    v_sum_d = _mm256_add_epi16(v_sum_d, v_diff);
    v_sse_d = _mm256_add_epi32(v_sse_d, v_sqrdiff);
    src += src_stride * 2;
    ref += ref_stride * 2;
  }
  __m256i v_sum00 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(v_sum_d));
  __m256i v_sum01 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(v_sum_d, 1));
  __m256i v_sum0 = _mm256_add_epi32(v_sum00, v_sum01);
  __m256i v_d_l = _mm256_unpacklo_epi32(v_sum0, v_sse_d);
  __m256i v_d_h = _mm256_unpackhi_epi32(v_sum0, v_sse_d);
  __m256i v_d_lh = _mm256_add_epi32(v_d_l, v_d_h);
  const __m128i v_d0_d = _mm256_castsi256_si128(v_d_lh);
  const __m128i v_d1_d = _mm256_extracti128_si256(v_d_lh, 1);
  __m128i v_d = _mm_add_epi32(v_d0_d, v_d1_d);
  v_d = _mm_add_epi32(v_d, _mm_srli_si128(v_d, 8));
  *sum = _mm_extract_epi32(v_d, 0);
  *sse = _mm_extract_epi32(v_d, 1);
}